

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char_const(&)[11],char_const(&)[6],std::__cxx11::string&,char_const(&)[5]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [11],char (*args_2) [6],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [5])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_260;
  cmAlphaNum local_228;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1b8;
  cmAlphaNum local_180;
  cmAlphaNum local_148;
  cmAlphaNum local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  string_view local_c0;
  string *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  local_110.RValueString_ = (string *)0x0;
  local_110.View_._M_str = (a->_M_dataplus)._M_p;
  local_110.View_._M_len = a->_M_string_length;
  local_d8.first = cmAlphaNum::View(&local_110);
  local_d8.second = local_110.RValueString_;
  local_260.Digits_[0] = *b;
  local_260.View_._M_str = local_260.Digits_;
  local_260.RValueString_ = (string *)0x0;
  local_260.View_._M_len = 1;
  local_c0 = cmAlphaNum::View(&local_260);
  local_b0 = local_260.RValueString_;
  local_148.RValueString_ = (string *)0x0;
  local_148.View_._M_str = (args->_M_dataplus)._M_p;
  local_148.View_._M_len = args->_M_string_length;
  local_a8 = cmAlphaNum::View(&local_148);
  local_98 = local_148.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_180,*args_1);
  local_90 = cmAlphaNum::View(&local_180);
  local_80 = local_180.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_1b8,*args_2);
  local_78 = cmAlphaNum::View(&local_1b8);
  local_68 = local_1b8.RValueString_;
  local_1f0.RValueString_ = (string *)0x0;
  local_1f0.View_._M_str = (args_3->_M_dataplus)._M_p;
  local_1f0.View_._M_len = args_3->_M_string_length;
  local_60 = cmAlphaNum::View(&local_1f0);
  local_50 = local_1f0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_228,*args_4);
  local_48 = cmAlphaNum::View(&local_228);
  local_38 = local_228.RValueString_;
  views._M_len = 7;
  views._M_array = &local_d8;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}